

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printJsonResult(Statement *query,ostream *stream,bool isFirstRow)

{
  int32_t iVar1;
  ostream *poVar2;
  char *pcVar3;
  double dVar4;
  Column local_d8;
  Column local_c0;
  Column local_a8;
  Column local_90;
  Column local_78;
  Column local_60;
  Column local_38;
  undefined1 local_19;
  ostream *poStack_18;
  bool isFirstRow_local;
  ostream *stream_local;
  Statement *query_local;
  
  local_19 = isFirstRow;
  poStack_18 = stream;
  stream_local = (ostream *)query;
  if (!isFirstRow) {
    poVar2 = std::operator<<(stream,",");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<(poStack_18,"{\"timestamp\":\"");
  SQLite::Statement::getColumn(&local_38,(Statement *)stream_local,0);
  pcVar3 = SQLite::Column::getText(&local_38,"");
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\",");
  poVar2 = std::operator<<(poVar2,"\"temp1\":");
  SQLite::Statement::getColumn(&local_60,(Statement *)stream_local,1);
  dVar4 = SQLite::Column::getDouble(&local_60);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"\"temp2\":");
  SQLite::Statement::getColumn(&local_78,(Statement *)stream_local,2);
  dVar4 = SQLite::Column::getDouble(&local_78);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"\"temp3\":");
  SQLite::Statement::getColumn(&local_90,(Statement *)stream_local,3);
  dVar4 = SQLite::Column::getDouble(&local_90);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"\"temp4\":");
  SQLite::Statement::getColumn(&local_a8,(Statement *)stream_local,4);
  dVar4 = SQLite::Column::getDouble(&local_a8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"\"valve1\":");
  SQLite::Statement::getColumn(&local_c0,(Statement *)stream_local,5);
  iVar1 = SQLite::Column::getInt(&local_c0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"\"valve2\":");
  SQLite::Statement::getColumn(&local_d8,(Statement *)stream_local,6);
  iVar1 = SQLite::Column::getInt(&local_d8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"}");
  SQLite::Column::~Column(&local_d8);
  SQLite::Column::~Column(&local_c0);
  SQLite::Column::~Column(&local_a8);
  SQLite::Column::~Column(&local_90);
  SQLite::Column::~Column(&local_78);
  SQLite::Column::~Column(&local_60);
  SQLite::Column::~Column(&local_38);
  return;
}

Assistant:

void printJsonResult(SQLite::Statement& query, std::ostream& stream, bool isFirstRow)
{
    if (!isFirstRow) {
        stream << "," << std::endl;
    }

    stream << "{\"timestamp\":\"" << query.getColumn(0).getText()   << "\","
           << "\"temp1\":"        << query.getColumn(1).getDouble() << ","
           << "\"temp2\":"        << query.getColumn(2).getDouble() << ","
           << "\"temp3\":"        << query.getColumn(3).getDouble() << ","
           << "\"temp4\":"        << query.getColumn(4).getDouble() << ","
           << "\"valve1\":"       << query.getColumn(5).getInt()    << ","
           << "\"valve2\":"       << query.getColumn(6).getInt()    << "}";
}